

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListDatatypeValidator.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::ListDatatypeValidator::compare
          (ListDatatypeValidator *this,XMLCh *lValue,XMLCh *rValue,MemoryManager *manager)

{
  ulong uVar1;
  int iVar2;
  BaseRefVectorOf<char16_t> *this_00;
  BaseRefVectorOf<char16_t> *this_01;
  char16_t *pcVar3;
  char16_t *pcVar4;
  XMLSize_t getAt;
  
  do {
    this = (ListDatatypeValidator *)
           (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  } while ((this->super_AbstractStringValidator).super_DatatypeValidator.fType == List);
  this_00 = XMLString::tokenizeString(lValue,manager);
  this_01 = XMLString::tokenizeString(rValue,manager);
  uVar1 = this_00->fCurCount;
  iVar2 = -1;
  if ((this_01->fCurCount <= uVar1) && (iVar2 = 1, uVar1 <= this_01->fCurCount)) {
    if (uVar1 != 0) {
      getAt = 0;
      do {
        pcVar3 = BaseRefVectorOf<char16_t>::elementAt(this_00,getAt);
        pcVar4 = BaseRefVectorOf<char16_t>::elementAt(this_01,getAt);
        iVar2 = (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
                  _vptr_XSerializable[10])(this,pcVar3,pcVar4,manager);
        if (iVar2 != 0) goto LAB_00303268;
        getAt = getAt + 1;
      } while (uVar1 != getAt);
    }
    iVar2 = 0;
  }
LAB_00303268:
  if (this_01 != (BaseRefVectorOf<char16_t> *)0x0) {
    (*this_01->_vptr_BaseRefVectorOf[1])(this_01);
  }
  if (this_00 != (BaseRefVectorOf<char16_t> *)0x0) {
    (*this_00->_vptr_BaseRefVectorOf[1])(this_00);
  }
  return iVar2;
}

Assistant:

int ListDatatypeValidator::compare(const XMLCh*     const lValue
                                 , const XMLCh*     const rValue
                                 , MemoryManager*   const manager)
{
    DatatypeValidator* theItemTypeDTV = getItemTypeDTV();
    BaseRefVectorOf<XMLCh>* lVector = XMLString::tokenizeString(lValue, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janl(lVector);
    BaseRefVectorOf<XMLCh>* rVector = XMLString::tokenizeString(rValue, manager);
    Janitor<BaseRefVectorOf<XMLCh> > janr(rVector);

    XMLSize_t lNumberOfTokens = lVector->size();
    XMLSize_t rNumberOfTokens = rVector->size();

    if (lNumberOfTokens < rNumberOfTokens)
        return -1;
    else if (lNumberOfTokens > rNumberOfTokens)
        return 1;
    else
    { //compare each token
        for ( XMLSize_t i = 0; i < lNumberOfTokens; i++)
        {
            int returnValue = theItemTypeDTV->compare(lVector->elementAt(i), rVector->elementAt(i), manager);
            if (returnValue != 0)
                return returnValue; //REVISIT: does it make sense to return -1 or +1..?
        }
        return 0;
    }

}